

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeRegVmLowerGraph.cpp
# Opt level: O2

void PrintInstruction(InstructionRegVmLowerGraphContext *ctx,char *constantData,
                     RegVmLoweredInstruction *lowInstruction)

{
  SynBase *pSVar1;
  VmConstant *constant;
  OutputContext *pOVar2;
  char *pcVar3;
  ulong uVar4;
  byte *pbVar5;
  uint uVar6;
  uint i;
  uint uVar7;
  char *pcVar8;
  ulong uVar9;
  char *pcVar10;
  char *pcVar11;
  uint uVar12;
  ulong uVar13;
  
  if (((ctx->showSource == true) && (pSVar1 = lowInstruction->location, pSVar1 != (SynBase *)0x0))
     && (pSVar1->isInternal == false)) {
    pcVar11 = (pSVar1->pos).begin;
    pcVar3 = pcVar11;
    uVar7 = 0;
    do {
      uVar6 = uVar7;
      pcVar10 = pcVar3;
      uVar9 = (ulong)uVar6;
      pcVar8 = pcVar11;
      if ((pcVar10 <= ctx->code) || (pcVar10[-1] == '\r')) break;
      pcVar3 = pcVar10 + -1;
      uVar7 = uVar6 + 1;
    } while (pcVar10[-1] != '\n');
    do {
      do {
        pbVar5 = (byte *)(pcVar8 + 1);
        pcVar8 = pcVar8 + 1;
        uVar9 = (ulong)((int)uVar9 + 1);
      } while (0xd < *pbVar5);
    } while ((0x2401U >> (*pbVar5 & 0x1f) & 1) == 0);
    if (ctx->showAnnotatedSource == true) {
      uVar12 = (int)pcVar11 - (int)pcVar10;
      uVar4 = (long)(pSVar1->pos).end - (long)pcVar10;
      uVar7 = (uint)uVar4;
      if (((pcVar10 != ctx->lastStart) || (uVar12 != ctx->lastStartOffset)) ||
         (uVar7 != ctx->lastEndOffset)) {
        Print(ctx->output,"// %.*s",uVar9,pcVar10);
        PrintLine(ctx->output);
        PrintIndent(ctx->output);
        if ((lowInstruction->location->pos).end < pcVar8) {
          Print(ctx->output,"// ");
          uVar9 = (ulong)uVar6;
          for (uVar13 = 0; uVar9 != uVar13; uVar13 = uVar13 + 1) {
            Print(ctx->output," ");
            if (pcVar10[uVar13] == '\t') {
              pcVar11 = "   ";
              if (uVar13 == 0) {
                pcVar11 = "  ";
              }
              Print(ctx->output,pcVar11);
            }
          }
          for (; uVar9 < (uVar4 & 0xffffffff); uVar9 = uVar9 + 1) {
            Print(ctx->output,"~");
            if (pcVar10[uVar9] == '\t') {
              pcVar11 = "~~~";
              if (uVar9 == 0) {
                pcVar11 = "~~";
              }
              Print(ctx->output,pcVar11);
            }
          }
          PrintLine(ctx->output);
          PrintIndent(ctx->output);
        }
        ctx->lastStart = pcVar10;
        ctx->lastStartOffset = uVar12;
        ctx->lastEndOffset = uVar7;
      }
    }
    else if (pcVar10 != ctx->lastStart) {
      Print(ctx->output,"// %.*s",uVar9,pcVar10);
      PrintLine(ctx->output);
      PrintIndent(ctx->output);
      ctx->lastStart = pcVar10;
    }
  }
  constant = lowInstruction->argument;
  if (constant == (VmConstant *)0x0) {
    uVar7 = 0;
  }
  else {
    uVar7 = constant->iValue;
  }
  PrintInstruction(ctx->output,constantData,(ExternFuncInfo *)0x0,(char *)0x0,lowInstruction->code,
                   lowInstruction->rA,lowInstruction->rB,lowInstruction->rC,uVar7,constant);
  if (((lowInstruction->preKillRegisters).count != 0) ||
     ((lowInstruction->postKillRegisters).count != 0)) {
    Print(ctx->output,"\t// kill[");
    for (uVar7 = 0; uVar7 < (lowInstruction->preKillRegisters).count; uVar7 = uVar7 + 1) {
      if (uVar7 != 0) {
        Print(ctx->output,", ");
      }
      pOVar2 = ctx->output;
      pbVar5 = SmallArray<unsigned_char,_8U>::operator[](&lowInstruction->preKillRegisters,uVar7);
      Print(pOVar2,"r%d*",(ulong)*pbVar5);
    }
    for (uVar7 = 0; uVar7 < (lowInstruction->postKillRegisters).count; uVar7 = uVar7 + 1) {
      if ((uVar7 != 0) || ((lowInstruction->preKillRegisters).count != 0)) {
        Print(ctx->output,", ");
      }
      pOVar2 = ctx->output;
      pbVar5 = SmallArray<unsigned_char,_8U>::operator[](&lowInstruction->postKillRegisters,uVar7);
      Print(pOVar2,"r%d",(ulong)*pbVar5);
    }
    Print(ctx->output,"]");
  }
  PrintLine(ctx->output);
  return;
}

Assistant:

void PrintInstruction(InstructionRegVmLowerGraphContext &ctx, char *constantData, RegVmLoweredInstruction *lowInstruction)
{
	if(ctx.showSource && lowInstruction->location && !lowInstruction->location->isInternal)
	{
		const char *start = lowInstruction->location->pos.begin;
		const char *end = start + 1;

		// TODO: handle source locations from imported modules
		while(start > ctx.code && *(start - 1) != '\r' && *(start - 1) != '\n')
			start--;

		while(*end && *end != '\r' && *end != '\n')
			end++;

		if (ctx.showAnnotatedSource)
		{
			unsigned startOffset = unsigned(lowInstruction->location->pos.begin - start);
			unsigned endOffset = unsigned(lowInstruction->location->pos.end - start);

			if(start != ctx.lastStart || startOffset != ctx.lastStartOffset || endOffset != ctx.lastEndOffset)
			{
				Print(ctx.output, "// %.*s", unsigned(end - start), start);
				PrintLine(ctx.output);
				PrintIndent(ctx.output);

				if (lowInstruction->location->pos.end < end)
				{
					Print(ctx.output, "// ");

					for (unsigned i = 0; i < startOffset; i++)
					{
						Print(ctx.output, " ");

						if (start[i] == '\t')
							Print(ctx.output, i == 0 ? "  " : "   ");
					}

					for (unsigned i = startOffset; i < endOffset; i++)
					{
						Print(ctx.output, "~");

						if (start[i] == '\t')
							Print(ctx.output, i == 0 ? "~~" : "~~~");
					}

					PrintLine(ctx.output);
					PrintIndent(ctx.output);
				}

				ctx.lastStart = start;
				ctx.lastStartOffset = startOffset;
				ctx.lastEndOffset = endOffset;
			}
		}
		else
		{
			if(start != ctx.lastStart)
			{
				Print(ctx.output, "// %.*s", unsigned(end - start), start);
				PrintLine(ctx.output);
				PrintIndent(ctx.output);

				ctx.lastStart = start;
			}
		}
	}

	PrintInstruction(ctx.output, constantData, NULL, NULL, RegVmInstructionCode(lowInstruction->code), lowInstruction->rA, lowInstruction->rB, lowInstruction->rC, lowInstruction->argument ? lowInstruction->argument->iValue : 0, lowInstruction->argument);

	if(!lowInstruction->preKillRegisters.empty() || !lowInstruction->postKillRegisters.empty())
	{
		Print(ctx.output, "\t// kill[");

		for(unsigned i = 0; i < lowInstruction->preKillRegisters.size(); i++)
		{
			if(i != 0)
				Print(ctx.output, ", ");

			Print(ctx.output, "r%d*", lowInstruction->preKillRegisters[i]);
		}

		for(unsigned i = 0; i < lowInstruction->postKillRegisters.size(); i++)
		{
			if(i != 0 || !lowInstruction->preKillRegisters.empty())
				Print(ctx.output, ", ");

			Print(ctx.output, "r%d", lowInstruction->postKillRegisters[i]);
		}

		Print(ctx.output, "]");
	}

	PrintLine(ctx.output);
}